

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O0

void __thiscall dynamicgraph::PoolStorage::writeGraph(PoolStorage *this,string *aFileName)

{
  Entity *this_00;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer ppVar5;
  string *psVar6;
  Entity *ent;
  _Self local_2e0;
  iterator iter;
  ofstream GraphFile;
  undefined1 local_d8 [8];
  tm ltimeformatted;
  time_t ltime;
  string local_78 [8];
  string GenericName;
  size_t IdxSeparatorFound;
  string tmp1;
  size_t IdxPointFound;
  string *aFileName_local;
  PoolStorage *this_local;
  
  tmp1.field_2._8_8_ = std::__cxx11::string::rfind((char *)aFileName,0x17dd7c);
  std::__cxx11::string::substr((ulong)&IdxSeparatorFound,(ulong)aFileName);
  lVar2 = std::__cxx11::string::rfind((char *)aFileName,0x17e0b9);
  std::__cxx11::string::string(local_78);
  if (lVar2 == -1) {
    std::__cxx11::string::operator=(local_78,(string *)&IdxSeparatorFound);
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&ltime,(ulong)&IdxSeparatorFound);
    std::__cxx11::string::operator=(local_78,(string *)&ltime);
    std::__cxx11::string::~string((string *)&ltime);
  }
  ltimeformatted.tm_zone = (char *)time((time_t *)0x0);
  localtime_r((time_t *)&ltimeformatted.tm_zone,(tm *)local_d8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&iter,pcVar3,_S_out);
  poVar4 = std::operator<<((ostream *)&iter,"/* This graph has been automatically generated. ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&iter,"   ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ltimeformatted.tm_mday + 0x76c);
  poVar4 = std::operator<<(poVar4," Month: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ltimeformatted.tm_hour + 1);
  poVar4 = std::operator<<(poVar4," Day: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ltimeformatted.tm_min);
  poVar4 = std::operator<<(poVar4," Time: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ltimeformatted.tm_sec);
  poVar4 = std::operator<<(poVar4,":");
  std::ostream::operator<<(poVar4,local_d8._4_4_);
  poVar4 = std::operator<<((ostream *)&iter," */");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&iter,"digraph \"");
  poVar4 = std::operator<<(poVar4,local_78);
  std::operator<<(poVar4,"\" { ");
  poVar4 = std::operator<<((ostream *)&iter,"\t graph [ label=\"");
  poVar4 = std::operator<<(poVar4,local_78);
  poVar4 = std::operator<<(poVar4,"\" bgcolor = white rankdir=LR ]");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"\t node [ fontcolor = black, color = black,");
  poVar4 = std::operator<<(poVar4,"fillcolor = gold1, style=filled, shape=box ] ; ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&iter,"\tsubgraph cluster_Entities { ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&iter,"\t} ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_2e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
       ::begin(&this->entityMap);
  while( true ) {
    ent = (Entity *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>_>
          ::end(&this->entityMap);
    bVar1 = std::operator!=(&local_2e0,(_Self *)&ent);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>
             ::operator->(&local_2e0);
    this_00 = ppVar5->second;
    poVar4 = std::operator<<((ostream *)&iter,"\"");
    psVar6 = Entity::getName_abi_cxx11_(this_00);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"\"");
    poVar4 = std::operator<<(poVar4," [ label = \"");
    psVar6 = Entity::getName_abi_cxx11_(this_00);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"\" ,");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"   fontcolor = black, color = black, fillcolor=cyan,");
    poVar4 = std::operator<<(poVar4," style=filled, shape=box ]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    (*this_00->_vptr_Entity[4])(this_00,&iter);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::Entity_*>_>
    ::operator++(&local_2e0);
  }
  poVar4 = std::operator<<((ostream *)&iter,"}");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(&iter);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&IdxSeparatorFound);
  return;
}

Assistant:

void PoolStorage::writeGraph(const std::string &aFileName) {
  size_t IdxPointFound = aFileName.rfind(".");
  std::string tmp1 = aFileName.substr(0, IdxPointFound);
  size_t IdxSeparatorFound = aFileName.rfind("/");
  std::string GenericName;
  if (IdxSeparatorFound != std::string::npos)
    GenericName = tmp1.substr(IdxSeparatorFound, tmp1.length());
  else
    GenericName = tmp1;

  /* Reading local time */
  time_t ltime;
  ltime = time(NULL);
  struct tm ltimeformatted;
#ifdef WIN32
  localtime_s(&ltimeformatted, &ltime);
#else
  localtime_r(&ltime, &ltimeformatted);
#endif /*WIN32*/

  /* Opening the file and writing the first comment. */
  std::ofstream GraphFile(aFileName.c_str(), std::ofstream::out);
  GraphFile << "/* This graph has been automatically generated. " << std::endl;
  GraphFile << "   " << 1900 + ltimeformatted.tm_year
            << " Month: " << 1 + ltimeformatted.tm_mon
            << " Day: " << ltimeformatted.tm_mday
            << " Time: " << ltimeformatted.tm_hour << ":"
            << ltimeformatted.tm_min;
  GraphFile << " */" << std::endl;
  GraphFile << "digraph \"" << GenericName << "\" { ";
  GraphFile << "\t graph [ label=\"" << GenericName
            << "\" bgcolor = white rankdir=LR ]" << std::endl
            << "\t node [ fontcolor = black, color = black,"
            << "fillcolor = gold1, style=filled, shape=box ] ; " << std::endl;
  GraphFile << "\tsubgraph cluster_Entities { " << std::endl;

  GraphFile << "\t} " << std::endl;

  for (Entities::iterator iter = entityMap.begin(); iter != entityMap.end();
       ++iter) {
    Entity *ent = iter->second;
    GraphFile << "\"" << ent->getName() << "\""
              << " [ label = \"" << ent->getName() << "\" ," << std::endl
              << "   fontcolor = black, color = black, fillcolor=cyan,"
              << " style=filled, shape=box ]" << std::endl;
    ent->writeGraph(GraphFile);
  }

  GraphFile << "}" << std::endl;

  GraphFile.close();
}